

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::delete_node(Patch *this,Node **node_to_delete)

{
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *this_00;
  pointer *pppNVar1;
  pointer ppNVar2;
  Node *__args;
  Text *pTVar3;
  iterator iVar4;
  
  if (*node_to_delete != (Node *)0x0) {
    ppNVar2 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
        .super__Vector_impl_data._M_finish != ppNVar2) {
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar2;
    }
    this_00 = &this->node_stack;
    iVar4._M_current =
         (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<Patch::Node*,std::allocator<Patch::Node*>>::_M_realloc_insert<Patch::Node*const&>
                ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar4,node_to_delete);
    }
    else {
      *iVar4._M_current = *node_to_delete;
      pppNVar1 = &(this->node_stack).
                  super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    while (ppNVar2 = (this->node_stack).
                     super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start != ppNVar2) {
      __args = ppNVar2[-1];
      iVar4._M_current = ppNVar2 + -1;
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
      if (__args->left != (Node *)0x0) {
        if (iVar4._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar4,
                     &__args->left);
        }
        else {
          *iVar4._M_current = __args->left;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      if (__args->right != (Node *)0x0) {
        iVar4._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)this_00,iVar4,
                     &__args->right);
        }
        else {
          *iVar4._M_current = __args->right;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      pTVar3 = (__args->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (pTVar3 != (Text *)0x0) {
        std::default_delete<Text>::operator()((default_delete<Text> *)&__args->new_text,pTVar3);
      }
      (__args->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl = (Text *)0x0;
      pTVar3 = (__args->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (pTVar3 != (Text *)0x0) {
        std::default_delete<Text>::operator()((default_delete<Text> *)&__args->old_text,pTVar3);
      }
      (__args->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl = (Text *)0x0;
      operator_delete(__args,0x50);
      this->change_count = this->change_count - 1;
    }
    *node_to_delete = (Node *)0x0;
  }
  return;
}

Assistant:

void Patch::delete_node(Node **node_to_delete) {
  if (*node_to_delete) {
    node_stack.clear();
    node_stack.push_back(*node_to_delete);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left)
        node_stack.push_back(node->left);
      if (node->right)
        node_stack.push_back(node->right);
      delete node;
      change_count--;
    }

    *node_to_delete = nullptr;
  }
}